

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O3

void ncnn::conv_im2col_sgemm_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_requant,
               Option *opt)

{
  char cVar1;
  float fVar2;
  float fVar3;
  size_t sVar4;
  size_t sVar5;
  pointer pfVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  int *piVar15;
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 uVar20;
  undefined1 *puVar21;
  ulong *puVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  char *pcVar26;
  char *pcVar27;
  uint _h;
  int iVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  uint _w;
  int iVar34;
  undefined1 *puVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  void *pvVar42;
  void *pvVar43;
  undefined1 *puVar44;
  long lVar45;
  long lVar46;
  int n;
  ulong uVar47;
  undefined1 *puVar48;
  undefined4 *puVar49;
  long lVar50;
  long lVar51;
  undefined1 *puVar52;
  long lVar53;
  undefined4 uVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar61;
  float fVar62;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [12];
  undefined1 auVar68 [12];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar69 [12];
  undefined1 auVar75 [16];
  undefined1 auVar70 [12];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [12];
  short sVar94;
  short sVar95;
  short sVar96;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar90 [16];
  short sVar97;
  short sVar99;
  undefined1 auVar98 [16];
  short sVar100;
  short sVar103;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  short sVar107;
  short sVar108;
  short sVar109;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  short sVar110;
  short sVar112;
  undefined1 auVar111 [16];
  undefined1 auVar113 [16];
  short sVar114;
  short sVar116;
  undefined1 auVar115 [16];
  float fVar117;
  float fVar118;
  int sum0 [4];
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  undefined1 local_1c8 [16];
  ulong local_1b8;
  ulong local_1b0;
  undefined8 local_1a8;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  float fStack_190;
  float fStack_18c;
  undefined1 *local_188;
  ulong local_180;
  Mat *local_178;
  ulong local_170;
  undefined1 *local_168;
  ulong local_160;
  undefined1 local_158 [64];
  size_t local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [64];
  size_t local_98;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 local_78 [64];
  size_t local_38;
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  
  uVar23 = bottom_blob->w;
  uVar38 = bottom_blob->c;
  iVar34 = top_blob->w;
  iVar37 = top_blob->h;
  local_1b8 = (ulong)top_blob->c;
  _w = uVar38 * kernel_h * kernel_w;
  _h = iVar37 * iVar34;
  local_38 = 0;
  local_78._0_8_ = (void *)0x0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_8_ = 0;
  local_78._24_4_ = 0;
  local_78._32_8_ = (Allocator *)0x0;
  local_78._40_4_ = 0;
  local_78._44_4_ = 0;
  local_78._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_198 = _kernel;
  local_178 = top_blob;
  Mat::create((Mat *)local_78,_w,_h,1,opt->workspace_allocator);
  if (0 < iVar37) {
    local_1a8 = (ulong)(stride_h * uVar23);
    lVar51 = 0;
    iVar36 = 0;
    iVar29 = 0;
    do {
      if (0 < iVar34) {
        iVar28 = 0;
        lVar50 = lVar51;
        do {
          if (0 < (int)uVar38) {
            uVar32 = 0;
            do {
              if (0 < kernel_h) {
                sVar4 = bottom_blob->cstep;
                sVar5 = bottom_blob->elemsize;
                pvVar42 = bottom_blob->data;
                iVar40 = 0;
                lVar45 = lVar50;
                do {
                  if (0 < kernel_w) {
                    uVar47 = 0;
                    do {
                      *(undefined1 *)(local_78._0_8_ + uVar47 + (long)iVar36) =
                           *(undefined1 *)
                            ((long)pvVar42 +
                            (long)((int)lVar45 + (int)uVar47) + sVar4 * uVar32 * sVar5);
                      uVar47 = uVar47 + 1;
                    } while ((uint)kernel_w != uVar47);
                    iVar36 = iVar36 + (int)uVar47;
                  }
                  iVar40 = iVar40 + 1;
                  lVar45 = lVar45 + (ulong)uVar23;
                } while (iVar40 != kernel_h);
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != uVar38);
          }
          iVar28 = iVar28 + 1;
          lVar50 = lVar50 + (ulong)(uint)stride_w;
        } while (iVar28 != iVar34);
      }
      iVar29 = iVar29 + 1;
      lVar51 = lVar51 + local_1a8;
    } while (iVar29 != iVar37);
  }
  iVar34 = kernel_h * kernel_w * 4;
  uVar23 = _h + 3;
  if (-1 < (int)_h) {
    uVar23 = _h;
  }
  local_118 = 0;
  local_158._0_8_ = (void *)0x0;
  local_158._8_4_ = 0;
  local_158._12_4_ = 0;
  local_158._16_8_ = 0;
  local_158._24_4_ = 0;
  local_158._32_8_ = (Allocator *)0x0;
  local_158._40_4_ = 0;
  local_158._44_4_ = 0;
  local_158._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_158,iVar34,uVar38,_h + ((int)uVar23 >> 2) * -3,1,opt->workspace_allocator
             );
  local_180 = local_1b8;
  if (0 < (int)_h >> 2) {
    local_1b0 = (ulong)(uint)((int)_h >> 2);
    lVar41 = 1;
    lVar45 = 2;
    lVar51 = 3;
    lVar50 = 0;
    uVar32 = 0;
    do {
      lVar24 = (long)(int)local_78._44_4_;
      puVar52 = (undefined1 *)(local_118 * uVar32 * local_158._16_8_ + local_158._0_8_);
      if ((int)_w < 2) {
        lVar24 = local_78._16_8_ * lVar24;
        lVar46 = uVar32 * 4 * lVar24;
        lVar53 = (uVar32 * 4 + 1) * lVar24;
        lVar33 = (uVar32 * 4 + 2) * lVar24;
        lVar24 = (uVar32 * 4 + 3) * lVar24;
        uVar23 = 0;
      }
      else {
        lVar46 = local_78._16_8_ * lVar50 * lVar24;
        lVar53 = local_78._16_8_ * lVar41 * lVar24;
        lVar33 = local_78._16_8_ * lVar45 * lVar24;
        local_1a8 = local_78._16_8_ * lVar51 * lVar24;
        lVar25 = 0;
        do {
          puVar35 = puVar52;
          puVar52 = (undefined1 *)
                    (local_158._0_8_ + lVar25 * 4 + local_118 * local_158._16_8_ * uVar32);
          *puVar52 = *(undefined1 *)(local_78._0_8_ + lVar25 + lVar46);
          puVar52[1] = *(undefined1 *)(local_78._0_8_ + lVar25 + lVar46 + 1);
          puVar52[2] = *(undefined1 *)(local_78._0_8_ + lVar25 + lVar53);
          puVar52[3] = *(undefined1 *)(local_78._0_8_ + lVar25 + lVar53 + 1);
          puVar52[4] = *(undefined1 *)(local_78._0_8_ + lVar25 + lVar33);
          puVar52[5] = *(undefined1 *)(local_78._0_8_ + lVar25 + lVar33 + 1);
          puVar52[6] = *(undefined1 *)(local_78._0_8_ + lVar25 + local_1a8);
          puVar52[7] = *(undefined1 *)(local_78._0_8_ + lVar25 + local_1a8 + 1);
          lVar24 = lVar25 + 2;
          iVar37 = (int)lVar25;
          lVar25 = lVar24;
          puVar52 = puVar52 + 8;
        } while (iVar37 + 3 < (int)_w);
        puVar52 = puVar35 + 8;
        lVar46 = lVar46 + lVar24;
        lVar53 = lVar53 + lVar24;
        lVar33 = lVar33 + lVar24;
        lVar24 = local_1a8 + lVar24;
        uVar23 = _w & 0xfffffffe;
      }
      if ((int)uVar23 < (int)_w) {
        lVar25 = 0;
        do {
          puVar52[lVar25 * 4] = *(undefined1 *)(local_78._0_8_ + lVar25 + lVar46);
          puVar52[lVar25 * 4 + 1] = *(undefined1 *)(local_78._0_8_ + lVar25 + lVar53);
          puVar52[lVar25 * 4 + 2] = *(undefined1 *)(local_78._0_8_ + lVar25 + lVar33);
          puVar52[lVar25 * 4 + 3] = *(undefined1 *)(local_78._0_8_ + lVar25 + lVar24);
          lVar25 = lVar25 + 1;
        } while (_w - uVar23 != (int)lVar25);
      }
      uVar32 = uVar32 + 1;
      lVar50 = lVar50 + 4;
      lVar41 = lVar41 + 4;
      lVar45 = lVar45 + 4;
      lVar51 = lVar51 + 4;
    } while (uVar32 != local_1b0);
  }
  if ((_h & 0xfffffffc) != _h) {
    lVar51 = (long)(int)(_h & 0xfffffffc);
    do {
      puVar52 = (undefined1 *)((int)local_78._44_4_ * lVar51 * local_78._16_8_ + local_78._0_8_);
      uVar23 = (uint)lVar51;
      uVar31 = uVar23 + 3;
      if (-1 < (int)uVar23) {
        uVar31 = uVar23;
      }
      puVar35 = (undefined1 *)
                ((long)(int)(((int)uVar31 >> 2) + (uVar23 - (uVar31 & 0xfffffffc))) * local_118 *
                 local_158._16_8_ + local_158._0_8_);
      if ((int)_w < 2) {
        uVar23 = 0;
      }
      else {
        iVar37 = 1;
        do {
          *puVar35 = *puVar52;
          puVar35[1] = puVar52[1];
          puVar35 = puVar35 + 2;
          puVar52 = puVar52 + 2;
          iVar37 = iVar37 + 2;
          uVar23 = _w & 0xfffffffe;
        } while (iVar37 < (int)_w);
      }
      if ((int)uVar23 < (int)_w) {
        lVar50 = 0;
        do {
          puVar35[lVar50] = puVar52[lVar50];
          lVar50 = lVar50 + 1;
        } while (_w - uVar23 != (int)lVar50);
      }
      lVar51 = lVar51 + 1;
    } while (lVar51 < (int)_h);
  }
  uVar23 = (uint)local_1b8;
  uVar31 = uVar23 + 3;
  if (-1 < (int)uVar23) {
    uVar31 = uVar23;
  }
  uVar30 = uVar23 + 3;
  if (-1 < (int)uVar23) {
    uVar30 = uVar23;
  }
  local_98 = 0;
  local_d8._0_8_ = (void *)0x0;
  local_d8._8_4_ = 0;
  local_d8._12_4_ = 0;
  local_d8._16_8_ = 0;
  local_d8._24_4_ = 0;
  local_d8._32_8_ = (Allocator *)0x0;
  local_d8._40_4_ = 0;
  local_d8._44_4_ = 0;
  local_d8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_d8,iVar34,uVar38,(uVar23 - (uVar30 & 0xfffffffc)) + ((int)uVar31 >> 2),1,
              opt->workspace_allocator);
  uVar23 = (int)uVar23 >> 2;
  local_180 = local_180 & 0xfffffffffffffffc;
  local_170 = (ulong)uVar23;
  if (0 < (int)uVar23) {
    iVar29 = uVar38 * kernel_h * kernel_w;
    iVar37 = iVar29 * 3;
    iVar34 = iVar29 * 4;
    iVar29 = iVar29 * 2;
    iVar36 = 0;
    uVar32 = 0;
    uVar38 = _w;
    do {
      pvVar42 = (void *)(local_98 * uVar32 * local_d8._16_8_ + local_d8._0_8_);
      if ((int)_w < 2) {
        iVar28 = (int)uVar32;
        lVar50 = (long)&local_198->data + (long)(int)((iVar28 * 4 + 3) * _w);
        lVar51 = (long)&local_198->data + (long)(int)((iVar28 * 4 + 2) * _w);
        lVar45 = (long)&local_198->data + (long)(int)((iVar28 * 4 + 1) * _w);
        lVar41 = (long)&local_198->data + (long)(int)(iVar28 * 4 * _w);
        uVar31 = 0;
      }
      else {
        lVar51 = 0;
        do {
          pvVar43 = pvVar42;
          pvVar42 = (void *)(local_d8._0_8_ + lVar51 * 4 + 8 + local_98 * local_d8._16_8_ * uVar32);
          *(undefined1 *)((long)pvVar42 + -8) =
               *(undefined1 *)((long)&local_198->data + lVar51 + iVar36);
          *(undefined1 *)((long)pvVar42 + -7) =
               *(undefined1 *)((long)&local_198->data + lVar51 + (long)iVar36 + 1);
          *(undefined1 *)((long)pvVar42 + -6) =
               *(undefined1 *)((long)&local_198->data + lVar51 + (int)uVar38);
          *(undefined1 *)((long)pvVar42 + -5) =
               *(undefined1 *)((long)&local_198->data + lVar51 + (long)(int)uVar38 + 1);
          *(undefined1 *)((long)pvVar42 + -4) =
               *(undefined1 *)((long)&local_198->data + lVar51 + iVar29);
          *(undefined1 *)((long)pvVar42 + -3) =
               *(undefined1 *)((long)&local_198->data + lVar51 + (long)iVar29 + 1);
          *(undefined1 *)((long)pvVar42 + -2) =
               *(undefined1 *)((long)&local_198->data + lVar51 + iVar37);
          *(undefined1 *)((long)pvVar42 + -1) =
               *(undefined1 *)((long)&local_198->data + lVar51 + (long)iVar37 + 1);
          lVar41 = lVar51 + 2;
          iVar28 = (int)lVar51;
          lVar51 = lVar41;
        } while (iVar28 + 3 < (int)_w);
        pvVar42 = (void *)((long)pvVar43 + 8);
        lVar50 = (long)&local_198->data + lVar41 + iVar37;
        lVar51 = (long)&local_198->data + lVar41 + iVar29;
        lVar45 = (long)&local_198->data + lVar41 + (int)uVar38;
        lVar41 = (long)&local_198->data + lVar41 + iVar36;
        uVar31 = _w & 0xfffffffe;
      }
      if ((int)uVar31 < (int)_w) {
        lVar24 = 0;
        do {
          *(undefined1 *)((long)pvVar42 + lVar24 * 4) = *(undefined1 *)(lVar41 + lVar24);
          *(undefined1 *)((long)pvVar42 + lVar24 * 4 + 1) = *(undefined1 *)(lVar45 + lVar24);
          *(undefined1 *)((long)pvVar42 + lVar24 * 4 + 2) = *(undefined1 *)(lVar51 + lVar24);
          *(undefined1 *)((long)pvVar42 + lVar24 * 4 + 3) = *(undefined1 *)(lVar50 + lVar24);
          lVar24 = lVar24 + 1;
        } while (_w - uVar31 != (int)lVar24);
      }
      uVar32 = uVar32 + 1;
      iVar37 = iVar37 + iVar34;
      iVar29 = iVar29 + iVar34;
      uVar38 = uVar38 + iVar34;
      iVar36 = iVar36 + iVar34;
    } while (uVar32 != local_170);
  }
  if ((int)local_180 != (int)local_1b8) {
    uVar32 = local_180;
    do {
      uVar38 = (uint)uVar32;
      uVar31 = uVar38 + 3;
      if (-1 < (int)uVar38) {
        uVar31 = uVar38;
      }
      puVar52 = (undefined1 *)
                ((long)(int)(((int)uVar31 >> 2) + (uVar38 - (uVar31 & 0xfffffffc))) * local_98 *
                 local_d8._16_8_ + local_d8._0_8_);
      puVar35 = (undefined1 *)((long)&local_198->data + (long)(int)(_w * uVar38));
      if ((int)_w < 2) {
        uVar38 = 0;
      }
      else {
        iVar34 = 1;
        do {
          *puVar52 = *puVar35;
          puVar52[1] = puVar35[1];
          puVar52 = puVar52 + 2;
          puVar35 = puVar35 + 2;
          iVar34 = iVar34 + 2;
          uVar38 = _w & 0xfffffffe;
        } while (iVar34 < (int)_w);
      }
      if ((int)uVar38 < (int)_w) {
        lVar51 = 0;
        do {
          puVar52[lVar51] = puVar35[lVar51];
          lVar51 = lVar51 + 1;
        } while (_w - uVar38 != (int)lVar51);
      }
      uVar32 = uVar32 + 1;
    } while ((long)uVar32 < (long)local_1b8);
  }
  local_168 = (undefined1 *)(ulong)_h;
  if (0 < (int)uVar23) {
    uVar32 = 0;
    do {
      lVar51 = uVar32 * 4 + 1;
      lVar50 = uVar32 * 4 + 2;
      lVar45 = uVar32 * 4 + 3;
      if (_bias == (Mat *)0x0) {
        fVar117 = 0.0;
        uVar54 = 0;
        fVar56 = 0.0;
        fVar118 = 0.0;
      }
      else {
        fVar56 = *(float *)(&_bias->data + uVar32 * 2);
        fVar118 = *(float *)((long)&_bias->data + uVar32 * 0x10 + 4);
        fVar117 = *(float *)(&_bias->refcount + uVar32 * 2);
        uVar54 = *(undefined4 *)((long)&_bias->refcount + uVar32 * 0x10 + 4);
      }
      sVar4 = local_178->cstep;
      pvVar42 = local_178->data;
      sVar5 = local_178->elemsize;
      puVar52 = (undefined1 *)(uVar32 * 4 * sVar4 * sVar5 + (long)pvVar42);
      puVar48 = (undefined1 *)(sVar4 * lVar51 * sVar5 + (long)pvVar42);
      puVar35 = (undefined1 *)(sVar4 * lVar50 * sVar5 + (long)pvVar42);
      puVar44 = (undefined1 *)(sVar4 * lVar45 * sVar5 + (long)pvVar42);
      pfVar6 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar57 = pfVar6[uVar32 * 8];
      fVar58 = pfVar6[uVar32 * 8 + 1];
      fVar62 = pfVar6[lVar51 * 2];
      fVar61 = pfVar6[lVar50 * 2];
      fVar2 = pfVar6[lVar45 * 2];
      fVar3 = pfVar6[lVar45 * 2 + 1];
      local_198 = (Mat *)CONCAT44(local_198._4_4_,uVar54);
      local_1a8 = CONCAT44(local_1a8._4_4_,pfVar6[lVar51 * 2 + 1]);
      local_1b0 = CONCAT44(local_1b0._4_4_,pfVar6[lVar50 * 2 + 1]);
      local_160 = uVar32;
      if ((int)_h < 4) {
        puVar21 = (undefined1 *)0x0;
      }
      else {
        puVar21 = (undefined1 *)0x0;
        do {
          puVar22 = (ulong *)(((ulong)puVar21 >> 2) * local_118 * local_158._16_8_ + local_158._0_8_
                             );
          pcVar26 = (char *)(local_98 * local_160 * local_d8._16_8_ + local_d8._0_8_);
          local_1c8 = (undefined1  [16])0x0;
          local_e8 = (undefined1  [16])0x0;
          local_f8 = (undefined1  [16])0x0;
          local_108 = (undefined1  [16])0x0;
          uVar23 = 0;
          if (1 < (int)_w) {
            local_1c8 = (undefined1  [16])0x0;
            local_e8._0_4_ = 0;
            local_e8._4_4_ = 0;
            local_e8._8_4_ = 0;
            local_e8._12_4_ = 0;
            local_f8._0_4_ = 0;
            local_f8._4_4_ = 0;
            local_f8._8_4_ = 0;
            local_f8._12_4_ = 0;
            iVar34 = 1;
            local_108._0_4_ = 0;
            local_108._4_4_ = 0;
            local_108._8_4_ = 0;
            local_108._12_4_ = 0;
            do {
              cVar1 = pcVar26[1];
              iVar37 = (int)cVar1;
              iVar29 = (int)*pcVar26;
              auVar101._4_4_ = iVar29;
              auVar101._0_4_ = iVar29;
              auVar101._8_4_ = iVar29;
              auVar101._12_4_ = iVar29;
              auVar67._0_8_ = CONCAT44(iVar37,iVar37);
              auVar67._8_4_ = iVar37;
              auVar85._12_4_ = iVar37;
              auVar85._0_12_ = auVar67;
              auVar83._8_8_ = 0;
              auVar83._0_8_ = *puVar22;
              auVar104 = psllw(auVar83,8);
              auVar104 = psraw(auVar104,8);
              auVar98 = pshuflw(ZEXT416((uint)(int)pcVar26[2]),ZEXT416((uint)(int)pcVar26[2]),0);
              auVar105._0_2_ = auVar104._0_2_;
              sVar97 = auVar98._0_2_ * auVar105._0_2_;
              sVar107 = auVar104._2_2_;
              sVar99 = auVar98._2_2_ * sVar107;
              sVar108 = auVar104._4_2_;
              sVar109 = auVar104._6_2_;
              auVar111 = pshuflw(ZEXT416((uint)(int)pcVar26[4]),ZEXT416((uint)(int)pcVar26[4]),0);
              sVar110 = auVar111._0_2_ * auVar105._0_2_;
              sVar112 = auVar111._2_2_ * sVar107;
              auVar113 = pshuflw(ZEXT416((uint)(int)pcVar26[6]),ZEXT416((uint)(int)pcVar26[6]),0);
              auVar9._10_2_ = 0;
              auVar9._0_10_ = auVar104._0_10_;
              auVar9._12_2_ = sVar109;
              auVar13._8_2_ = sVar108;
              auVar13._0_8_ = auVar104._0_8_;
              auVar13._10_4_ = auVar9._10_4_;
              auVar16._6_8_ = 0;
              auVar16._0_6_ = auVar13._8_6_;
              auVar105._6_8_ = SUB148(auVar16 << 0x40,6);
              auVar105._4_2_ = sVar107;
              auVar105._2_2_ = 0;
              auVar105._14_2_ = 0;
              auVar106 = pmaddwd(auVar105,auVar101);
              auVar104 = psraw(auVar83,8);
              auVar102 = pshuflw(ZEXT416((uint)(int)pcVar26[3]),ZEXT416((uint)(int)pcVar26[3]),0);
              auVar84._0_2_ = auVar104._0_2_;
              sVar100 = auVar102._0_2_ * auVar84._0_2_;
              sVar94 = auVar104._2_2_;
              sVar103 = auVar102._2_2_ * sVar94;
              sVar95 = auVar104._4_2_;
              sVar96 = auVar104._6_2_;
              auVar115 = pshuflw(ZEXT416((uint)(int)pcVar26[5]),ZEXT416((uint)(int)pcVar26[5]),0);
              sVar114 = auVar115._0_2_ * auVar84._0_2_;
              sVar116 = auVar115._2_2_ * sVar94;
              auVar83 = pshuflw(ZEXT416((uint)(int)pcVar26[7]),ZEXT416((uint)(int)pcVar26[7]),0);
              auVar7._10_2_ = 0;
              auVar7._0_10_ = auVar104._0_10_;
              auVar7._12_2_ = sVar96;
              auVar10._8_2_ = sVar95;
              auVar10._0_8_ = auVar104._0_8_;
              auVar10._10_4_ = auVar7._10_4_;
              auVar17._6_8_ = 0;
              auVar17._0_6_ = auVar10._8_6_;
              auVar84._6_8_ = SUB148(auVar17 << 0x40,6);
              auVar84._4_2_ = sVar94;
              auVar84._2_2_ = 0;
              auVar84._14_2_ = 0;
              auVar85 = pmaddwd(auVar84,auVar85);
              auVar86._0_4_ = auVar85._0_4_;
              iVar29 = local_1c8._4_4_;
              iVar36 = local_1c8._8_4_;
              iVar28 = local_1c8._12_4_;
              local_1c8._0_4_ = local_1c8._0_4_ + auVar86._0_4_ + auVar106._0_4_;
              local_1c8._4_4_ = iVar29 + auVar85._4_4_ + auVar106._4_4_;
              local_1c8._8_4_ = iVar36 + auVar85._8_4_ + auVar106._8_4_;
              local_1c8._12_4_ = iVar28 + auVar85._12_4_ + auVar106._12_4_;
              auVar71._12_2_ = (undefined2)(cVar1 >> 7);
              auVar71._0_12_ = auVar67;
              auVar71._14_2_ = auVar102._6_2_ * sVar96;
              auVar106._12_4_ = auVar71._12_4_;
              auVar106._0_10_ = auVar67._0_10_;
              auVar106._10_2_ = auVar102._4_2_ * sVar95;
              auVar102._10_6_ = auVar106._10_6_;
              auVar102._8_2_ = (short)cVar1;
              auVar102._0_8_ = auVar67._0_8_;
              auVar104._8_8_ = auVar102._8_8_;
              auVar104._6_2_ = sVar103;
              auVar104._4_2_ = (undefined2)(cVar1 >> 7);
              auVar104._0_4_ = iVar37;
              auVar72._0_4_ = (int)sVar100;
              iVar37 = auVar104._4_4_ >> 0x10;
              auVar68._0_8_ = CONCAT44(iVar37,auVar72._0_4_);
              auVar68._8_4_ = auVar102._8_4_ >> 0x10;
              auVar74._12_2_ = sVar103 >> 0xf;
              auVar74._0_12_ = auVar68;
              auVar74._14_2_ = auVar98._6_2_ * sVar109;
              auVar73._12_4_ = auVar74._12_4_;
              auVar73._0_10_ = auVar68._0_10_;
              auVar73._10_2_ = auVar98._4_2_ * sVar108;
              auVar98._10_6_ = auVar73._10_6_;
              auVar98._8_2_ = sVar103;
              auVar98._0_8_ = auVar68._0_8_;
              auVar72._8_8_ = auVar98._8_8_;
              auVar72._6_2_ = sVar99;
              auVar72._4_2_ = sVar100 >> 0xf;
              auVar75._0_4_ = (int)sVar97;
              iVar29 = auVar72._4_4_ >> 0x10;
              auVar69._0_8_ = CONCAT44(iVar29,auVar75._0_4_);
              auVar69._8_4_ = auVar98._8_4_ >> 0x10;
              local_e8._0_4_ = local_e8._0_4_ + auVar72._0_4_ + auVar75._0_4_;
              local_e8._4_4_ = local_e8._4_4_ + iVar37 + iVar29;
              local_e8._8_4_ = local_e8._8_4_ + auVar68._8_4_ + auVar69._8_4_;
              local_e8._12_4_ =
                   local_e8._12_4_ + (auVar106._12_4_ >> 0x10) + (auVar73._12_4_ >> 0x10);
              auVar77._12_2_ = sVar99 >> 0xf;
              auVar77._0_12_ = auVar69;
              auVar77._14_2_ = auVar111._6_2_ * sVar109;
              auVar76._12_4_ = auVar77._12_4_;
              auVar76._0_10_ = auVar69._0_10_;
              auVar76._10_2_ = auVar111._4_2_ * sVar108;
              auVar111._10_6_ = auVar76._10_6_;
              auVar111._8_2_ = sVar99;
              auVar111._0_8_ = auVar69._0_8_;
              auVar75._8_8_ = auVar111._8_8_;
              auVar75._6_2_ = sVar112;
              auVar75._4_2_ = sVar97 >> 0xf;
              auVar78._0_4_ = (int)sVar110;
              iVar37 = auVar75._4_4_ >> 0x10;
              auVar70._0_8_ = CONCAT44(iVar37,auVar78._0_4_);
              auVar70._8_4_ = auVar111._8_4_ >> 0x10;
              auVar89._0_12_ = auVar85._0_12_;
              auVar89._12_2_ = auVar85._6_2_;
              auVar89._14_2_ = auVar115._6_2_ * sVar96;
              auVar88._12_4_ = auVar89._12_4_;
              auVar88._0_10_ = auVar85._0_10_;
              auVar88._10_2_ = auVar115._4_2_ * sVar95;
              auVar87._10_6_ = auVar88._10_6_;
              auVar87._0_8_ = auVar85._0_8_;
              auVar87._8_2_ = auVar85._4_2_;
              auVar86._8_8_ = auVar87._8_8_;
              auVar86._6_2_ = sVar116;
              auVar86._4_2_ = auVar85._2_2_;
              auVar90._0_4_ = (int)sVar114;
              iVar29 = auVar86._4_4_ >> 0x10;
              auVar82._0_8_ = CONCAT44(iVar29,auVar90._0_4_);
              auVar82._8_4_ = auVar87._8_4_ >> 0x10;
              local_f8._0_4_ = local_f8._0_4_ + auVar90._0_4_ + auVar78._0_4_;
              local_f8._4_4_ = local_f8._4_4_ + iVar29 + iVar37;
              local_f8._8_4_ = local_f8._8_4_ + auVar82._8_4_ + auVar70._8_4_;
              local_f8._12_4_ =
                   local_f8._12_4_ + (auVar88._12_4_ >> 0x10) + (auVar76._12_4_ >> 0x10);
              auVar80._12_2_ = sVar112 >> 0xf;
              auVar80._0_12_ = auVar70;
              auVar80._14_2_ = auVar113._6_2_ * sVar109;
              auVar79._12_4_ = auVar80._12_4_;
              auVar79._0_10_ = auVar70._0_10_;
              auVar79._10_2_ = auVar113._4_2_ * sVar108;
              auVar115._10_6_ = auVar79._10_6_;
              auVar115._8_2_ = sVar112;
              auVar115._0_8_ = auVar70._0_8_;
              auVar78._8_8_ = auVar115._8_8_;
              auVar78._6_2_ = auVar113._2_2_ * sVar107;
              auVar78._4_2_ = sVar110 >> 0xf;
              auVar93._12_2_ = sVar116 >> 0xf;
              auVar93._0_12_ = auVar82;
              auVar93._14_2_ = auVar83._6_2_ * sVar96;
              auVar92._12_4_ = auVar93._12_4_;
              auVar92._0_10_ = auVar82._0_10_;
              auVar92._10_2_ = auVar83._4_2_ * sVar95;
              auVar91._10_6_ = auVar92._10_6_;
              auVar91._8_2_ = sVar116;
              auVar91._0_8_ = auVar82._0_8_;
              auVar90._8_8_ = auVar91._8_8_;
              auVar90._6_2_ = auVar83._2_2_ * sVar94;
              auVar90._4_2_ = sVar114 >> 0xf;
              local_108._0_4_ =
                   local_108._0_4_ + (int)(short)(auVar83._0_2_ * auVar84._0_2_) +
                   (int)(short)(auVar113._0_2_ * auVar105._0_2_);
              local_108._4_4_ = local_108._4_4_ + (auVar90._4_4_ >> 0x10) + (auVar78._4_4_ >> 0x10);
              local_108._8_4_ = local_108._8_4_ + (auVar91._8_4_ >> 0x10) + (auVar115._8_4_ >> 0x10)
              ;
              local_108._12_4_ =
                   local_108._12_4_ + (auVar92._12_4_ >> 0x10) + (auVar79._12_4_ >> 0x10);
              pcVar26 = pcVar26 + 8;
              puVar22 = puVar22 + 1;
              iVar34 = iVar34 + 2;
            } while (iVar34 < (int)_w);
            uVar23 = _w & 0xfffffffe;
          }
          if ((int)uVar23 < (int)_w) {
            do {
              cVar1 = *pcVar26;
              lVar51 = 0;
              do {
                iVar34 = (int)*(char *)((long)puVar22 + lVar51);
                *(int *)(local_1c8 + lVar51 * 4) = *(int *)(local_1c8 + lVar51 * 4) + iVar34 * cVar1
                ;
                *(int *)(local_e8 + lVar51 * 4) =
                     *(int *)(local_e8 + lVar51 * 4) + pcVar26[1] * iVar34;
                *(int *)(local_f8 + lVar51 * 4) =
                     *(int *)(local_f8 + lVar51 * 4) + pcVar26[2] * iVar34;
                *(int *)(local_108 + lVar51 * 4) =
                     *(int *)(local_108 + lVar51 * 4) + pcVar26[3] * iVar34;
                lVar51 = lVar51 + 1;
              } while (lVar51 != 4);
              pcVar26 = pcVar26 + 4;
              puVar22 = (ulong *)((long)puVar22 + 4);
              uVar23 = uVar23 + 1;
            } while (uVar23 != _w);
          }
          lVar51 = 0;
          local_188 = puVar21;
          do {
            fVar55 = roundf(((float)*(int *)(local_1c8 + lVar51 * 4) * fVar57 + fVar56) * fVar58);
            iVar34 = (int)fVar55;
            if (iVar34 < -0x7e) {
              iVar34 = -0x7f;
            }
            uVar20 = (undefined1)iVar34;
            if (0x7e < iVar34) {
              uVar20 = 0x7f;
            }
            puVar52[lVar51] = uVar20;
            fVar55 = roundf(((float)*(int *)(local_e8 + lVar51 * 4) * fVar62 + fVar118) *
                            (float)local_1a8);
            iVar34 = (int)fVar55;
            if (iVar34 < -0x7e) {
              iVar34 = -0x7f;
            }
            if (0x7e < iVar34) {
              iVar34 = 0x7f;
            }
            puVar48[lVar51] = (char)iVar34;
            fVar55 = roundf(((float)*(int *)(local_f8 + lVar51 * 4) * fVar61 + fVar117) *
                            (float)local_1b0);
            iVar34 = (int)fVar55;
            if (iVar34 < -0x7e) {
              iVar34 = -0x7f;
            }
            uVar20 = (undefined1)iVar34;
            if (0x7e < iVar34) {
              uVar20 = 0x7f;
            }
            puVar35[lVar51] = uVar20;
            fVar55 = roundf(((float)*(int *)(local_108 + lVar51 * 4) * fVar2 + (float)local_198) *
                            fVar3);
            iVar34 = (int)fVar55;
            if (iVar34 < -0x7e) {
              iVar34 = -0x7f;
            }
            uVar20 = (undefined1)iVar34;
            if (0x7e < iVar34) {
              uVar20 = 0x7f;
            }
            puVar44[lVar51] = uVar20;
            lVar51 = lVar51 + 1;
          } while (lVar51 != 4);
          puVar52 = puVar52 + 4;
          puVar48 = puVar48 + 4;
          puVar35 = puVar35 + 4;
          puVar44 = puVar44 + 4;
          puVar21 = local_188 + 4;
        } while (local_188 + 7 < local_168);
      }
      if ((int)puVar21 < (int)_h) {
        do {
          pcVar26 = (char *)((((uint)puVar21 & 3) + ((uint)((ulong)puVar21 >> 2) & 0x3fffffff)) *
                             local_118 * local_158._16_8_ + local_158._0_8_);
          pcVar27 = (char *)(local_98 * local_160 * local_d8._16_8_ + local_d8._0_8_);
          iVar34 = 0;
          if ((int)_w < 2) {
            iVar29 = 0;
            iVar37 = 0;
            iVar36 = 0;
            uVar23 = 0;
          }
          else {
            iVar36 = 0;
            iVar28 = 1;
            iVar37 = 0;
            iVar29 = 0;
            iVar34 = 0;
            do {
              iVar40 = (int)*pcVar26;
              iVar39 = (int)pcVar26[1];
              iVar34 = pcVar27[1] * iVar39 + *pcVar27 * iVar40 + iVar34;
              iVar29 = pcVar27[3] * iVar39 + pcVar27[2] * iVar40 + iVar29;
              iVar37 = pcVar27[5] * iVar39 + pcVar27[4] * iVar40 + iVar37;
              iVar36 = pcVar27[7] * iVar39 + pcVar27[6] * iVar40 + iVar36;
              pcVar27 = pcVar27 + 8;
              pcVar26 = pcVar26 + 2;
              iVar28 = iVar28 + 2;
              uVar23 = _w & 0xfffffffe;
            } while (iVar28 < (int)_w);
          }
          if ((int)uVar23 < (int)_w) {
            lVar51 = 0;
            do {
              iVar28 = (int)pcVar26[lVar51];
              iVar34 = iVar34 + pcVar27[lVar51 * 4] * iVar28;
              iVar29 = iVar29 + pcVar27[lVar51 * 4 + 1] * iVar28;
              iVar37 = iVar37 + pcVar27[lVar51 * 4 + 2] * iVar28;
              iVar36 = iVar36 + pcVar27[lVar51 * 4 + 3] * iVar28;
              lVar51 = lVar51 + 1;
            } while (_w - uVar23 != (int)lVar51);
          }
          local_188 = puVar52;
          local_88 = puVar21;
          local_80 = puVar44;
          fVar55 = roundf(((float)iVar34 * fVar57 + fVar56) * fVar58);
          puVar52 = local_188;
          iVar34 = (int)fVar55;
          if (iVar34 < -0x7e) {
            iVar34 = -0x7f;
          }
          uVar20 = (undefined1)iVar34;
          if (0x7e < iVar34) {
            uVar20 = 0x7f;
          }
          *local_188 = uVar20;
          fVar55 = roundf(((float)iVar29 * fVar62 + fVar118) * (float)local_1a8);
          iVar34 = (int)fVar55;
          if (iVar34 < -0x7e) {
            iVar34 = -0x7f;
          }
          if (0x7e < iVar34) {
            iVar34 = 0x7f;
          }
          *puVar48 = (char)iVar34;
          fVar55 = roundf(((float)iVar37 * fVar61 + fVar117) * (float)local_1b0);
          iVar34 = (int)fVar55;
          if (iVar34 < -0x7e) {
            iVar34 = -0x7f;
          }
          if (0x7e < iVar34) {
            iVar34 = 0x7f;
          }
          *puVar35 = (char)iVar34;
          fVar55 = roundf(((float)iVar36 * fVar2 + (float)local_198) * fVar3);
          iVar34 = (int)fVar55;
          if (iVar34 < -0x7e) {
            iVar34 = -0x7f;
          }
          if (0x7e < iVar34) {
            iVar34 = 0x7f;
          }
          *local_80 = (char)iVar34;
          puVar52 = puVar52 + 1;
          puVar48 = puVar48 + 1;
          puVar35 = puVar35 + 1;
          puVar44 = local_80 + 1;
          uVar23 = (int)local_88 + 1;
          puVar21 = (undefined1 *)(ulong)uVar23;
        } while (uVar23 != _h);
      }
      uVar32 = local_160 + 1;
    } while (uVar32 != local_170);
  }
  if ((int)local_180 != (int)local_1b8) {
    lVar51 = (long)(int)local_180;
    do {
      if (_bias == (Mat *)0x0) {
        fVar56 = 0.0;
      }
      else {
        fVar56 = *(float *)((long)&_bias->data + lVar51 * 4);
      }
      puVar49 = (undefined4 *)
                (local_178->cstep * lVar51 * local_178->elemsize + (long)local_178->data);
      uVar32 = 0;
      pfVar6 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar118 = pfVar6[lVar51 * 2];
      fVar117 = pfVar6[lVar51 * 2 + 1];
      uVar23 = (uint)lVar51;
      if (3 < (int)_h) {
        uVar38 = uVar23 + 3;
        if (-1 < (int)uVar23) {
          uVar38 = uVar23;
        }
        local_198 = (Mat *)CONCAT44(fVar118,fVar118);
        local_1a8 = CONCAT44(fVar117,fVar117);
        uVar47 = 0;
        fStack_1a0 = fVar117;
        fStack_19c = fVar117;
        fStack_190 = fVar118;
        fStack_18c = fVar118;
        do {
          puVar22 = (ulong *)((uVar47 >> 2) * local_118 * local_158._16_8_ + local_158._0_8_);
          pcVar26 = (char *)(local_98 *
                             (long)(int)(((int)uVar38 >> 2) + (uVar23 - (uVar38 & 0xfffffffc))) *
                             local_d8._16_8_ + local_d8._0_8_);
          local_1c8 = (undefined1  [16])0x0;
          uVar31 = 0;
          if (1 < (int)_w) {
            iVar34 = 1;
            local_1c8._0_4_ = 0;
            local_1c8._4_4_ = 0;
            local_1c8._8_4_ = 0;
            local_1c8._12_4_ = 0;
            do {
              iVar37 = (int)pcVar26[1];
              iVar29 = (int)*pcVar26;
              auVar113._4_4_ = iVar29;
              auVar113._0_4_ = iVar29;
              auVar113._8_4_ = iVar29;
              auVar113._12_4_ = iVar29;
              auVar64._4_4_ = iVar37;
              auVar64._0_4_ = iVar37;
              auVar64._8_4_ = iVar37;
              auVar64._12_4_ = iVar37;
              auVar65._8_8_ = 0;
              auVar65._0_8_ = *puVar22;
              auVar85 = psllw(auVar65,8);
              auVar85 = psraw(auVar85,8);
              auVar11._10_2_ = 0;
              auVar11._0_10_ = auVar85._0_10_;
              auVar11._12_2_ = auVar85._6_2_;
              auVar14._8_2_ = auVar85._4_2_;
              auVar14._0_8_ = auVar85._0_8_;
              auVar14._10_4_ = auVar11._10_4_;
              auVar18._6_8_ = 0;
              auVar18._0_6_ = auVar14._8_6_;
              auVar81._6_8_ = SUB148(auVar18 << 0x40,6);
              auVar81._4_2_ = auVar85._2_2_;
              auVar81._0_2_ = auVar85._0_2_;
              auVar81._2_2_ = 0;
              auVar81._14_2_ = 0;
              auVar104 = pmaddwd(auVar81,auVar113);
              auVar85 = psraw(auVar65,8);
              auVar8._10_2_ = 0;
              auVar8._0_10_ = auVar85._0_10_;
              auVar8._12_2_ = auVar85._6_2_;
              auVar12._8_2_ = auVar85._4_2_;
              auVar12._0_8_ = auVar85._0_8_;
              auVar12._10_4_ = auVar8._10_4_;
              auVar19._6_8_ = 0;
              auVar19._0_6_ = auVar12._8_6_;
              auVar66._6_8_ = SUB148(auVar19 << 0x40,6);
              auVar66._4_2_ = auVar85._2_2_;
              auVar66._0_2_ = auVar85._0_2_;
              auVar66._2_2_ = 0;
              auVar66._14_2_ = 0;
              auVar85 = pmaddwd(auVar66,auVar64);
              local_1c8._0_4_ = local_1c8._0_4_ + auVar85._0_4_ + auVar104._0_4_;
              local_1c8._4_4_ = local_1c8._4_4_ + auVar85._4_4_ + auVar104._4_4_;
              local_1c8._8_4_ = local_1c8._8_4_ + auVar85._8_4_ + auVar104._8_4_;
              local_1c8._12_4_ = local_1c8._12_4_ + auVar85._12_4_ + auVar104._12_4_;
              pcVar26 = pcVar26 + 2;
              puVar22 = puVar22 + 1;
              iVar34 = iVar34 + 2;
            } while (iVar34 < (int)_w);
            uVar31 = _w & 0xfffffffe;
          }
          if ((int)uVar31 < (int)_w) {
            do {
              cVar1 = *pcVar26;
              lVar50 = 0;
              do {
                *(int *)(local_1c8 + lVar50 * 4) =
                     *(int *)(local_1c8 + lVar50 * 4) +
                     (int)*(char *)((long)puVar22 + lVar50) * (int)cVar1;
                lVar50 = lVar50 + 1;
              } while (lVar50 != 4);
              pcVar26 = pcVar26 + 1;
              puVar22 = (ulong *)((long)puVar22 + 4);
              uVar31 = uVar31 + 1;
            } while (uVar31 != _w);
          }
          fVar57 = ((float)(int)local_1c8._0_4_ * (float)local_198 + fVar56) * (float)local_1a8;
          fVar61 = ((float)(int)local_1c8._4_4_ * local_198._4_4_ + fVar56) * local_1a8._4_4_;
          fVar62 = ((float)(int)local_1c8._8_4_ * fStack_190 + fVar56) * fStack_1a0;
          fVar58 = roundf(((float)(int)local_1c8._12_4_ * fStack_18c + fVar56) * fStack_19c);
          fVar62 = roundf(fVar62);
          fVar57 = roundf(fVar57);
          fVar61 = roundf(fVar61);
          auVar59._0_4_ = (int)fVar57;
          auVar59._4_4_ = (int)fVar61;
          auVar59._8_4_ = (int)fVar62;
          auVar59._12_4_ = (int)fVar58;
          auVar63._0_4_ = -(uint)((int)DAT_00314640 < auVar59._0_4_);
          auVar63._4_4_ = -(uint)(DAT_00314640._4_4_ < auVar59._4_4_);
          auVar63._8_4_ = -(uint)(DAT_00314640._8_4_ < auVar59._8_4_);
          auVar63._12_4_ = -(uint)(DAT_00314640._12_4_ < auVar59._12_4_);
          auVar85 = ~auVar63 & _DAT_00314640 | auVar59 & auVar63;
          auVar60._0_4_ = -(uint)(auVar85._0_4_ < (int)DAT_00314650);
          auVar60._4_4_ = -(uint)(auVar85._4_4_ < DAT_00314650._4_4_);
          auVar60._8_4_ = -(uint)(auVar85._8_4_ < DAT_00314650._8_4_);
          auVar60._12_4_ = -(uint)(auVar85._12_4_ < DAT_00314650._12_4_);
          auVar85 = ~auVar60 & _DAT_00314650 | auVar85 & auVar60;
          auVar85 = packssdw(auVar85,auVar85);
          auVar85 = packsswb(auVar85,auVar85);
          *puVar49 = auVar85._0_4_;
          puVar49 = puVar49 + 1;
          uVar32 = uVar47 + 4;
          puVar52 = (undefined1 *)(uVar47 + 7);
          uVar47 = uVar32;
        } while (puVar52 < local_168);
      }
      if ((int)uVar32 < (int)_h) {
        uVar38 = uVar23 + 3;
        if (-1 < (int)uVar23) {
          uVar38 = uVar23;
        }
        do {
          if ((int)_w < 1) {
            fVar57 = 0.0;
          }
          else {
            lVar50 = 0;
            iVar34 = 0;
            do {
              iVar34 = iVar34 + (int)*(char *)(local_158._0_8_ +
                                              lVar50 + local_118 * local_158._16_8_ *
                                                       (ulong)(((uint)uVar32 & 3) +
                                                              ((uint)(uVar32 >> 2) & 0x3fffffff))) *
                                (int)*(char *)(local_d8._0_8_ +
                                              lVar50 + local_98 *
                                                       (long)(int)(((int)uVar38 >> 2) +
                                                                  (uVar23 - (uVar38 & 0xfffffffc)))
                                                       * local_d8._16_8_);
              lVar50 = lVar50 + 1;
            } while (_w != (uint)lVar50);
            fVar57 = (float)iVar34;
          }
          fVar57 = roundf((fVar57 * fVar118 + fVar56) * fVar117);
          iVar34 = (int)fVar57;
          if (iVar34 < -0x7e) {
            iVar34 = -0x7f;
          }
          uVar20 = (undefined1)iVar34;
          if (0x7e < iVar34) {
            uVar20 = 0x7f;
          }
          *(undefined1 *)puVar49 = uVar20;
          puVar49 = (undefined4 *)((long)puVar49 + 1);
          uVar31 = (uint)uVar32 + 1;
          uVar32 = (ulong)uVar31;
        } while (uVar31 != _h);
      }
      lVar51 = lVar51 + 1;
    } while (lVar51 < (long)local_1b8);
  }
  piVar15 = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if ((Allocator *)local_d8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_d8._0_8_ != (void *)0x0) {
          free((void *)local_d8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_d8._32_8_)[3])();
      }
    }
  }
  piVar15 = (int *)CONCAT44(local_158._12_4_,local_158._8_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if ((Allocator *)local_158._32_8_ == (Allocator *)0x0) {
        if ((void *)local_158._0_8_ != (void *)0x0) {
          free((void *)local_158._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_158._32_8_)[3])();
      }
    }
  }
  piVar15 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if ((Allocator *)local_78._32_8_ == (Allocator *)0x0) {
        if ((void *)local_78._0_8_ != (void *)0x0) {
          free((void *)local_78._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_78._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_requant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel,
        const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat& _bias, std::vector<float> scale_requant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h * kernel_w * inch, outw * outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                for (int p = 0; p < inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh;                // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4 * kernel_size, inch, out_size / 4 + out_size % 4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i + 1);
            const signed char* img2 = bottom_im2row.row<signed char>(i + 2);
            const signed char* img3 = bottom_im2row.row<signed char>(i + 3);

            signed char* tmpptr = bottom_tm.channel(i / 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i / 4 + i % 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4 * kernel_size, inch, outch / 4 + outch % 4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p + 0) * inch * kernel_size;
            const signed char* k1 = kernel + (p + 1) * inch * kernel_size;
            const signed char* k2 = kernel + (p + 2) * inch * kernel_size;
            const signed char* k3 = kernel + (p + 3) * inch * kernel_size;

            signed char* ktmp = kernel_tm.channel(p / 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q += 2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            const signed char* k0 = kernel + (p + 0) * inch * kernel_size;

            signed char* ktmp = kernel_tm.channel(p / 4 + p % 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int i = pp * 4;

            signed char* output0 = top_blob.channel(i);
            signed char* output1 = top_blob.channel(i + 1);
            signed char* output2 = top_blob.channel(i + 2);
            signed char* output3 = top_blob.channel(i + 3);

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i + 1] : 0.f;
            const float bias2 = bias ? bias[i + 2] : 0.f;
            const float bias3 = bias ? bias[i + 3] : 0.f;

            const float scale_requant_in0 = scale_requant[2 * i];
            const float scale_requant_out0 = scale_requant[2 * i + 1];
            const float scale_requant_in1 = scale_requant[2 * (i + 1)];
            const float scale_requant_out1 = scale_requant[2 * (i + 1) + 1];
            const float scale_requant_in2 = scale_requant[2 * (i + 2)];
            const float scale_requant_out2 = scale_requant[2 * (i + 2) + 1];
            const float scale_requant_in3 = scale_requant[2 * (i + 3)];
            const float scale_requant_out3 = scale_requant[2 * (i + 3) + 1];

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                signed char* vb = bottom_tm.channel(j / 4);
                signed char* va = kernel_tm.channel(i / 4);

                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};

                int k = 0;

                for (; k + 1 < K; k = k + 2)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2 * n]; // k0
                        sum0[n] += (int)va[1] * vb[2 * n + 1];

                        sum1[n] += (int)va[2] * vb[2 * n]; // k1
                        sum1[n] += (int)va[3] * vb[2 * n + 1];

                        sum2[n] += (int)va[4] * vb[2 * n]; // k2
                        sum2[n] += (int)va[5] * vb[2 * n + 1];

                        sum3[n] += (int)va[6] * vb[2 * n]; // k3
                        sum3[n] += (int)va[7] * vb[2 * n + 1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k < K; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }

                    va += 4;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output0[n] = float2int8(((float)sum0[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                    output1[n] = float2int8(((float)sum1[n] * scale_requant_in1 + bias1) * scale_requant_out1);
                    output2[n] = float2int8(((float)sum2[n] * scale_requant_in2 + bias2) * scale_requant_out2);
                    output3[n] = float2int8(((float)sum3[n] * scale_requant_in3 + bias3) * scale_requant_out3);
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j < N; j++)
            {
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j / 4 + j % 4);
                signed char* va = kernel_tm.channel(i / 4);

                int k = 0;

                for (; k + 1 < K; k = k + 2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k < K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }

                output0[0] = float2int8(((float)sum0 * scale_requant_in0 + bias0) * scale_requant_out0);
                output1[0] = float2int8(((float)sum1 * scale_requant_in1 + bias1) * scale_requant_out1);
                output2[0] = float2int8(((float)sum2 * scale_requant_in2 + bias2) * scale_requant_out2);
                output3[0] = float2int8(((float)sum3 * scale_requant_in3 + bias3) * scale_requant_out3);

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_outch_start; i < outch; i++)
        {
            signed char* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            const float scale_requant_in0 = scale_requant[2 * i];
            const float scale_requant_out0 = scale_requant[2 * i + 1];

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                signed char* vb = bottom_tm.channel(j / 4);
                signed char* va = kernel_tm.channel(i / 4 + i % 4);
                int sum[4] = {0};

                int k = 0;
                for (; k + 1 < K; k = k + 2)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2 * n];
                        sum[n] += (int)va[1] * vb[2 * n + 1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k < K; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output[n] = float2int8(((float)sum[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                }
                output += 4;
            }

            for (; j < N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j / 4 + j % 4);
                signed char* va = kernel_tm.channel(i / 4 + i % 4);

                for (int k = 0; k < K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = float2int8(((float)sum * scale_requant_in0 + bias0) * scale_requant_out0);

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}